

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astFunctionApplicationNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  uint uVar1;
  ulong uVar2;
  sysbvm_tuple_t sVar3;
  size_t immediateTypeTag;
  sysbvm_stackFrameRecord_s *type;
  ulong uVar4;
  ulong uVar5;
  anon_struct_24_3_ee1c534f gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_108;
  sysbvm_tuple_t sStack_100;
  sysbvm_tuple_t local_f8;
  sysbvm_astFunctionApplicationNode_t *local_e8;
  sysbvm_tuple_t sStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  sysbvm_stackFrameRecord_s *local_a8;
  sysbvm_tuple_t sStack_a0;
  sysbvm_tuple_t local_98;
  undefined1 local_88 [8];
  sysbvm_astFunctionApplicationNode_t *psStack_80;
  sysbvm_tuple_t local_78;
  undefined1 *local_70;
  sysbvm_stackFrameRecord_t local_60;
  sysbvm_tuple_t local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  sysbvm_astFunctionApplicationNode_t **local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_30 = &local_e8;
  local_a8 = (sysbvm_stackFrameRecord_s *)0x0;
  sStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8 = (sysbvm_astFunctionApplicationNode_t *)0x0;
  sStack_e0 = 0;
  local_98 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 0xb;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_e8 = (sysbvm_astFunctionApplicationNode_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  (local_e8->super).analyzerToken = sVar3;
  local_60.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_60.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_50 = (local_e8->super).sourcePosition;
  sysbvm_stackFrame_pushRecord(&local_60);
  sStack_e0 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                        (context,local_e8->functionExpression,0,arguments[1]);
  local_e8->functionExpression = sStack_e0;
  if (sStack_e0 == 0 || (sStack_e0 & 0xf) != 0) {
    local_a8 = (sysbvm_stackFrameRecord_s *)0x0;
    immediateTypeTag = 0;
  }
  else {
    local_a8 = *(sysbvm_stackFrameRecord_s **)(sStack_e0 + 0x20);
    immediateTypeTag = (ulong)local_a8 & 0xf;
    if (immediateTypeTag == 0 && local_a8 != (sysbvm_stackFrameRecord_s *)0x0) {
      type = local_a8->previous;
      goto LAB_001238c3;
    }
    if ((int)immediateTypeTag == 0xf) {
      type = (sysbvm_stackFrameRecord_s *)
             sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)local_a8 >> 4);
      goto LAB_001238c3;
    }
  }
  type = (sysbvm_stackFrameRecord_s *)sysbvm_tuple_getImmediateTypeWithTag(context,immediateTypeTag)
  ;
LAB_001238c3:
  sStack_a0 = sysbvm_type_getAnalyzeAndTypeCheckFunctionApplicationNodeWithEnvironment
                        (context,(sysbvm_tuple_t)type);
  if (sStack_a0 == 0) {
    local_108 = 0;
    sStack_100 = 0;
    local_f8 = 0;
    local_88 = (undefined1  [8])0x0;
    psStack_80 = (sysbvm_astFunctionApplicationNode_t *)0x0;
    local_78 = 3;
    local_70 = (undefined1 *)&local_108;
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_88);
    uVar5 = local_e8->arguments;
    if (uVar5 == 0 || (uVar5 & 0xf) != 0) {
      local_f8 = sysbvm_array_create(context,0);
    }
    else {
      uVar1 = *(uint *)(uVar5 + 0xc);
      uVar5 = (ulong)(uVar1 >> 3);
      local_f8 = sysbvm_array_create(context,uVar5);
      if (7 < uVar1) {
        uVar4 = 0;
        do {
          uVar2 = local_e8->arguments;
          if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
            local_108 = *(sysbvm_tuple_t *)(uVar2 + 0x10 + uVar4 * 8);
          }
          else {
            local_108 = 0;
          }
          sStack_100 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                                 (context,local_108,0,arguments[1]);
          if ((local_f8 & 0xf) == 0 && local_f8 != 0) {
            *(sysbvm_tuple_t *)(local_f8 + 0x10 + uVar4 * 8) = sStack_100;
          }
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
      }
    }
    local_e8->arguments = local_f8;
    (local_e8->super).analyzedType = (context->roots).anyValueType;
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_88);
    local_98 = sysbvm_astFunctionApplicationNode_optimizePureApplication(context,&local_e8);
  }
  else {
    local_78 = arguments[1];
    local_88 = (undefined1  [8])local_a8;
    psStack_80 = local_e8;
    local_98 = sysbvm_function_apply(context,sStack_a0,3,(sysbvm_tuple_t *)local_88,0);
  }
  sysbvm_stackFrame_popRecord(&local_60);
  sysbvm_stackFrame_popRecord(&local_48);
  return local_98;
}

Assistant:

static sysbvm_tuple_t sysbvm_astFunctionApplicationNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astFunctionApplicationNode_t *applicationNode;
        sysbvm_tuple_t analyzedFunctionExpression;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t analyzedArgument;
        sysbvm_tuple_t analyzedArguments;
        
        sysbvm_tuple_t literalFunction;
        sysbvm_tuple_t pureCallResult;
        sysbvm_tuple_t argumentValue;
        sysbvm_tuple_t functionType;

        sysbvm_tuple_t typeCheckFunction;

        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.applicationNode = (sysbvm_astFunctionApplicationNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.applicationNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.applicationNode->super.sourcePosition);

    gcFrame.analyzedFunctionExpression = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.applicationNode->functionExpression, *environment);
    gcFrame.applicationNode->functionExpression = gcFrame.analyzedFunctionExpression;
    gcFrame.functionType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedFunctionExpression);

    // Type check the function application.
    gcFrame.typeCheckFunction = sysbvm_type_getAnalyzeAndTypeCheckFunctionApplicationNodeWithEnvironment(context, sysbvm_tuple_getType(context, gcFrame.functionType));
    if(gcFrame.typeCheckFunction)
        gcFrame.result = sysbvm_function_apply3(context, gcFrame.typeCheckFunction, gcFrame.functionType, (sysbvm_tuple_t)gcFrame.applicationNode, *environment);
    else
        gcFrame.result = sysbvm_astFunctionApplicationNode_defaultTypeCheck(context, &gcFrame.applicationNode, environment);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}